

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::TryFindSymbolInFallbackDatabase
          (DescriptorPool *this,StringPiece name)

{
  Tables *this_00;
  StringPiece name_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  FileDescriptor *pFVar4;
  string name_string;
  FileDescriptorProto file_proto;
  StringPiece local_130;
  StringPiece local_120;
  string local_110;
  FileDescriptorProto local_f0;
  
  local_130.length_ = name.length_;
  local_130.ptr_ = name.ptr_;
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    return false;
  }
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_110,&local_130);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&(((this->tables_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                    _M_head_impl)->known_bad_symbols_)._M_h,&local_110);
  if (sVar3 != 0) {
    bVar1 = false;
    goto LAB_00356a15;
  }
  FileDescriptorProto::FileDescriptorProto(&local_f0);
  name_00.length_ = local_130.length_;
  name_00.ptr_ = local_130.ptr_;
  bVar1 = IsSubSymbolOfBuiltType(this,name_00);
  if ((bVar1) ||
     (iVar2 = (*this->fallback_database_->_vptr_DescriptorDatabase[3])
                        (this->fallback_database_,&local_110,&local_f0), (char)iVar2 == '\0')) {
LAB_003569f7:
    std::__detail::
    _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&((this->tables_)._M_t.
                  super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                 _M_head_impl)->known_bad_symbols_,&local_110);
    bVar1 = false;
  }
  else {
    this_00 = (this->tables_)._M_t.
              super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl
    ;
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_120,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)local_f0.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    pFVar4 = Tables::FindFile(this_00,local_120);
    if (pFVar4 != (FileDescriptor *)0x0) goto LAB_003569f7;
    pFVar4 = BuildFileFromDatabase(this,&local_f0);
    bVar1 = true;
    if (pFVar4 == (FileDescriptor *)0x0) goto LAB_003569f7;
  }
  FileDescriptorProto::~FileDescriptorProto(&local_f0);
LAB_00356a15:
  std::__cxx11::string::~string((string *)&local_110);
  return bVar1;
}

Assistant:

bool DescriptorPool::TryFindSymbolInFallbackDatabase(
    StringPiece name) const {
  if (fallback_database_ == nullptr) return false;

  auto name_string = std::string(name);
  if (tables_->known_bad_symbols_.count(name_string) > 0) return false;

  FileDescriptorProto file_proto;
  if (  // We skip looking in the fallback database if the name is a sub-symbol
        // of any descriptor that already exists in the descriptor pool (except
        // for package descriptors).  This is valid because all symbols except
        // for packages are defined in a single file, so if the symbol exists
        // then we should already have its definition.
        //
        // The other reason to do this is to support "overriding" type
        // definitions by merging two databases that define the same type. (Yes,
        // people do this.)  The main difficulty with making this work is that
        // FindFileContainingSymbol() is allowed to return both false positives
        // (e.g., SimpleDescriptorDatabase, UpgradedDescriptorDatabase) and
        // false negatives (e.g. ProtoFileParser, SourceTreeDescriptorDatabase).
        // When two such databases are merged, looking up a non-existent
        // sub-symbol of a type that already exists in the descriptor pool can
        // result in an attempt to load multiple definitions of the same type.
        // The check below avoids this.
      IsSubSymbolOfBuiltType(name)

      // Look up file containing this symbol in fallback database.
      || !fallback_database_->FindFileContainingSymbol(name_string, &file_proto)

      // Check if we've already built this file. If so, it apparently doesn't
      // contain the symbol we're looking for.  Some DescriptorDatabases
      // return false positives.
      || tables_->FindFile(file_proto.name()) != nullptr

      // Build the file.
      || BuildFileFromDatabase(file_proto) == nullptr) {
    tables_->known_bad_symbols_.insert(std::move(name_string));
    return false;
  }

  return true;
}